

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

_Bool CrawlIdentifierCharacters(Lexer *lexer)

{
  int *piVar1;
  int iVar2;
  ushort *puVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  long lVar7;
  ushort **ppuVar8;
  char cVar9;
  bool bVar10;
  char character;
  
  iVar6 = (lexer->tracker).currentTokenPosition;
  iVar2 = lexer->length;
  character = -1;
  cVar9 = -1;
  if (iVar6 < iVar2) {
    cVar9 = lexer->rawSourceCode[iVar6];
  }
  lVar7 = (long)iVar6 + 1;
  iVar5 = (int)lVar7;
  (lexer->tracker).currentTokenPosition = iVar5;
  if (iVar5 < iVar2) {
    character = lexer->rawSourceCode[lVar7];
  }
  (lexer->tracker).currentTokenPosition = iVar6;
  ppuVar8 = __ctype_b_loc();
  puVar3 = *ppuVar8;
  _Var4 = (_Bool)(cVar9 == '_' | (*(byte *)((long)puVar3 + (long)cVar9 * 2 + 1) & 4) >> 2);
  if (_Var4 != true) {
    return _Var4;
  }
  (lexer->tracker).tokenStart = iVar6;
  bVar10 = false;
  while (((puVar3[character] & 8) != 0 || (_Var4 = IsCharacter(character,"$_"), _Var4))) {
    lVar7 = (long)(lexer->tracker).currentTokenPosition + 1;
    iVar6 = (int)lVar7;
    (lexer->tracker).currentTokenPosition = iVar6;
    character = -1;
    if (iVar6 < iVar2) {
      character = lexer->rawSourceCode[lVar7];
    }
    (lexer->tracker).currentTokenPosition = iVar6;
    bVar10 = true;
  }
  if (!bVar10) {
    piVar1 = &(lexer->tracker).currentTokenPosition;
    *piVar1 = *piVar1 + 1;
  }
  (lexer->tracker).tokenEnd = (lexer->tracker).currentTokenPosition;
  return true;
}

Assistant:

bool CrawlIdentifierCharacters(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	if (isalpha(currentChar) || currentChar == '_'){
		SetTokenStart(lexer);
		char* checkCharacters = "$_";
		bool inside = false;
		while (true){
			if (!isalnum(nextChar) && !IsCharacter(nextChar, checkCharacters)) break;
			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
			inside = true;
		}
		if (!inside) GetNextCharacter(lexer);
		SetTokenEnd(lexer);
		return true;
	}
	return false;
}